

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

bool __thiscall
IssuingDistributionPoint::Decode
          (IssuingDistributionPoint *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  DecodeResult DVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t *psVar5;
  undefined1 local_58 [8];
  SequenceHelper sh;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  IssuingDistributionPoint *this_local;
  
  sh._32_8_ = cbUsed;
  SequenceHelper::SequenceHelper((SequenceHelper *)local_58,cbUsed);
  DVar2 = SequenceHelper::Init
                    ((SequenceHelper *)local_58,pIn,cbIn,
                     &(this->super_ExtensionBase).super_DerBase.cbData);
  if (DVar2 == Failed) {
    this_local._7_1_ = false;
  }
  else if (DVar2 - Null < 2) {
    this_local._7_1_ = true;
  }
  else {
    puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
    sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
    psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
    bVar1 = ContextSpecificHolder<DistributionPointName,_(unsigned_char)'\xa0',_(OptionType)0>::
            Decode(&this->distributionPoint,puVar3,sVar4,psVar5);
    if (bVar1) {
      SequenceHelper::Update((SequenceHelper *)local_58);
    }
    bVar1 = SequenceHelper::IsAllUsed((SequenceHelper *)local_58);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
      sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
      psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
      bVar1 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa1',_(OptionType)0>::Decode
                        (&this->onlyContainsUserCerts,puVar3,sVar4,psVar5);
      if (bVar1) {
        SequenceHelper::Update((SequenceHelper *)local_58);
      }
      bVar1 = SequenceHelper::IsAllUsed((SequenceHelper *)local_58);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
        sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
        psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
        bVar1 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa2',_(OptionType)0>::Decode
                          (&this->onlyContainsCACerts,puVar3,sVar4,psVar5);
        if (bVar1) {
          SequenceHelper::Update((SequenceHelper *)local_58);
        }
        bVar1 = SequenceHelper::IsAllUsed((SequenceHelper *)local_58);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
          sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
          psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
          bVar1 = ContextSpecificHolder<BitString,_(unsigned_char)'\xa3',_(OptionType)0>::Decode
                            (&this->onlySomeReasons,puVar3,sVar4,psVar5);
          if (bVar1) {
            SequenceHelper::Update((SequenceHelper *)local_58);
          }
          bVar1 = SequenceHelper::IsAllUsed((SequenceHelper *)local_58);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
            sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
            psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
            bVar1 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa4',_(OptionType)0>::Decode
                              (&this->indirectCRL,puVar3,sVar4,psVar5);
            if (bVar1) {
              SequenceHelper::Update((SequenceHelper *)local_58);
            }
            bVar1 = SequenceHelper::IsAllUsed((SequenceHelper *)local_58);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
              sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
              psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
              bVar1 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa5',_(OptionType)0>::Decode
                                (&this->onlyContainsAttributeCerts,puVar3,sVar4,psVar5);
              if (bVar1) {
                SequenceHelper::Update((SequenceHelper *)local_58);
              }
              this_local._7_1_ = true;
            }
          }
        }
      }
    }
  }
  SequenceHelper::~SequenceHelper((SequenceHelper *)local_58);
  return this_local._7_1_;
}

Assistant:

virtual bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed) override
    {
        SequenceHelper sh(cbUsed);

        switch (sh.Init(pIn, cbIn, this->cbData))
        {
        case DecodeResult::Failed:
            return false;
        case DecodeResult::Null:
        case DecodeResult::EmptySequence:
            return true;
        case DecodeResult::Success:
            break;
        }

        // Everything is optional, but it can't be empty.
        /*
            Conforming CRLs issuers MUST NOT issue CRLs where the DER encoding of
            the issuing distribution point extension is an empty sequence.  That
            is, if onlyContainsUserCerts, onlyContainsCACerts, indirectCRL, and
            onlyContainsAttributeCerts are all FALSE, then either the
            distributionPoint field or the onlySomeReasons field MUST be present.
        */
        if (distributionPoint.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlyContainsUserCerts.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlyContainsCACerts.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlySomeReasons.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (indirectCRL.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlyContainsAttributeCerts.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        return true;
    }